

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Io.hpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
io::readFileToString
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *path)

{
  byte bVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_279;
  undefined1 local_278 [12];
  undefined1 local_268 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined4 local_234;
  istream_type local_220 [8];
  ifstream file;
  string *path_local;
  
  std::ifstream::ifstream(local_220,path,8);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_268,local_220);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_278);
    std::allocator<char>::allocator();
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)local_268._0_8_;
    __beg._M_c = local_268._8_4_;
    __end._12_4_ = 0;
    __end._M_sbuf = (streambuf_type *)local_278._0_8_;
    __end._M_c = local_278._8_4_;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)&local_258,__beg,__end,&local_279);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_279);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  local_234 = 1;
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> readFileToString(const std::string & path) {

  std::ifstream file{path};

  if (file.fail()) {
    return std::nullopt;
  }

  return std::string{std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>()};
}